

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_specialization_constant_op
          (CompilerGLSL *this,SPIRConstantOp *constant)

{
  bool bVar1;
  uint32_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [8];
  string name;
  SPIRType *type;
  SPIRConstantOp *constant_local;
  CompilerGLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&constant->basetype);
  name.field_2._8_8_ = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  bVar1 = Compiler::type_is_top_level_block(&this->super_Compiler,(SPIRType *)name.field_2._8_8_);
  if (!bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(constant->super_IVariant).self);
    add_resource_name(this,uVar2);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(constant->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_40,this,(ulong)uVar2,1);
    (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_60,this,name.field_2._8_8_,local_40,0);
    (*(this->super_Compiler)._vptr_Compiler[0x18])(&local_90,this,constant);
    statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (this,(char (*) [7])0xf60225,&local_60,(char (*) [4])0xf415bc,&local_90,
               (char (*) [2])0xf651e6);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_specialization_constant_op(const SPIRConstantOp &constant)
{
	auto &type = get<SPIRType>(constant.basetype);
	// This will break. It is bogus and should not be legal.
	if (type_is_top_level_block(type))
		return;
	add_resource_name(constant.self);
	auto name = to_name(constant.self);
	statement("const ", variable_decl(type, name), " = ", constant_op_expression(constant), ";");
}